

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

Offset<reflection::RPCCall> __thiscall
flatbuffers::RPCCall::Serialize(RPCCall *this,FlatBufferBuilder *builder,Parser *parser)

{
  bool bVar1;
  Offset<reflection::RPCCall> OVar2;
  Offset<reflection::Object> local_40;
  Offset<reflection::Object> local_3c;
  Offset<flatbuffers::String> local_38;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> local_34;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> local_30;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> docs__;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> attr__;
  Offset<flatbuffers::String> name__;
  Parser *parser_local;
  FlatBufferBuilder *builder_local;
  RPCCall *this_local;
  
  docs__.o = (offset_type)
             FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>(builder,(string *)this)
  ;
  local_30 = Definition::SerializeAttributes(&this->super_Definition,builder,parser);
  if (((parser->opts).binary_schema_comments & 1U) != 0) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&(this->super_Definition).doc_comment);
    if (!bVar1) {
      local_34 = FlatBufferBuilderImpl<false>::
                 CreateVectorOfStrings<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                           (builder,&(this->super_Definition).doc_comment);
      goto LAB_0013583b;
    }
  }
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>::Offset
            (&local_34,0);
LAB_0013583b:
  local_38.o = docs__.o;
  Offset<reflection::Object>::Offset
            (&local_3c,(this->request->super_Definition).serialized_location);
  Offset<reflection::Object>::Offset
            (&local_40,(this->response->super_Definition).serialized_location);
  OVar2 = reflection::CreateRPCCall(builder,local_38,local_3c,local_40,local_30,local_34);
  return (Offset<reflection::RPCCall>)OVar2.o;
}

Assistant:

Offset<reflection::RPCCall> RPCCall::Serialize(FlatBufferBuilder *builder,
                                               const Parser &parser) const {
  auto name__ = builder->CreateString(name);
  auto attr__ = SerializeAttributes(builder, parser);
  auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                    ? builder->CreateVectorOfStrings(doc_comment)
                    : 0;
  return reflection::CreateRPCCall(
      *builder, name__, request->serialized_location,
      response->serialized_location, attr__, docs__);
}